

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O2

void CheckId(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  Lexer *pLVar1;
  Bool BVar2;
  Node *pNVar3;
  uint uVar4;
  
  if ((attval == (AttVal *)0x0) || (attval->value == (ctmbstr)0x0)) {
    uVar4 = 0x256;
    goto LAB_00135cd6;
  }
  pLVar1 = doc->lexer;
  BVar2 = prvTidyIsValidHTMLID(attval->value);
  if (BVar2 == no) {
    if (pLVar1->isvoyager == no) {
LAB_00135c7f:
      uVar4 = 0x22b;
    }
    else {
      BVar2 = prvTidyIsValidXMLID(attval->value);
      uVar4 = 0x292;
      if (BVar2 == no) goto LAB_00135c7f;
    }
    prvTidyReportAttrError(doc,node,attval,uVar4);
  }
  pNVar3 = GetNodeByAnchor(doc,attval->value);
  if (pNVar3 == node || pNVar3 == (Node *)0x0) {
    AddAnchor(doc,attval->value,node);
    return;
  }
  if (node->implicit == no) {
    uVar4 = 0x223;
  }
  else {
    uVar4 = 0x224;
  }
LAB_00135cd6:
  prvTidyReportAttrError(doc,node,attval,uVar4);
  return;
}

Assistant:

void CheckId( TidyDocImpl* doc, Node *node, AttVal *attval )
{
    Lexer* lexer = doc->lexer;
    Node *old;

    if (!AttrHasValue(attval))
    {
        TY_(ReportAttrError)( doc, node, attval, MISSING_ATTR_VALUE);
        return;
    }

    if (!TY_(IsValidHTMLID)(attval->value))
    {
        if (lexer->isvoyager && TY_(IsValidXMLID)(attval->value))
            TY_(ReportAttrError)( doc, node, attval, XML_ID_SYNTAX);
        else
            TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);
    }

    if ((old = GetNodeByAnchor(doc, attval->value)) &&  old != node)
    {
        if (node->implicit) /* Is #709 - improve warning text */
            TY_(ReportAttrError)(doc, node, attval, ANCHOR_DUPLICATED);
        else
            TY_(ReportAttrError)( doc, node, attval, ANCHOR_NOT_UNIQUE);
    }
    else
        AddAnchor( doc, attval->value, node );
}